

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

void __thiscall
Js::FunctionBody::SetPropertyIdsOfFormals(FunctionBody *this,PropertyIdArray *formalArgs)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  PropertyIdOnRegSlotsContainer *pPVar4;
  
  if (formalArgs == (PropertyIdArray *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1355,"(formalArgs)","formalArgs");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  pPVar4 = FunctionProxy::
           GetAuxPtr<(Js::FunctionProxy::AuxPointerType)9,Js::PropertyIdOnRegSlotsContainer*>
                     ((FunctionProxy *)this);
  if (pPVar4 == (PropertyIdOnRegSlotsContainer *)0x0) {
    pPVar4 = PropertyIdOnRegSlotsContainer::New
                       (((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->
                        recycler);
    FunctionProxy::
    SetAuxPtr<(Js::FunctionProxy::AuxPointerType)9,Js::PropertyIdOnRegSlotsContainer*>
              ((FunctionProxy *)this,pPVar4);
  }
  pPVar4 = FunctionProxy::
           GetAuxPtr<(Js::FunctionProxy::AuxPointerType)9,Js::PropertyIdOnRegSlotsContainer*>
                     ((FunctionProxy *)this);
  Memory::WriteBarrierPtr<Js::PropertyIdArray>::WriteBarrierSet
            (&pPVar4->propertyIdsForFormalArgs,formalArgs);
  return;
}

Assistant:

void FunctionBody::SetPropertyIdsOfFormals(PropertyIdArray * formalArgs)
    {
        Assert(formalArgs);
        if (this->GetPropertyIdOnRegSlotsContainer() == nullptr)
        {
            this->SetPropertyIdOnRegSlotsContainer(PropertyIdOnRegSlotsContainer::New(m_scriptContext->GetRecycler()));
        }
        this->GetPropertyIdOnRegSlotsContainer()->SetFormalArgs(formalArgs);
    }